

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O1

void record_token_rgb(float *r,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tokens)

{
  char *pcVar1;
  char *in_RAX;
  int *piVar2;
  undefined8 uVar3;
  int iVar4;
  float fVar5;
  char *local_38;
  
  pcVar1 = (tokens->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  local_38 = in_RAX;
  piVar2 = __errno_location();
  iVar4 = *piVar2;
  *piVar2 = 0;
  fVar5 = strtof(pcVar1,&local_38);
  if (local_38 == pcVar1) {
    std::__throw_invalid_argument("stof");
  }
  else {
    if (*piVar2 == 0) {
LAB_0010ba29:
      *piVar2 = iVar4;
    }
    else if (*piVar2 == 0x22) {
      fVar5 = (float)std::__throw_out_of_range("stof");
      goto LAB_0010ba29;
    }
    *r = fVar5;
    pcVar1 = (tokens->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p;
    iVar4 = *piVar2;
    *piVar2 = 0;
    fVar5 = strtof(pcVar1,&local_38);
    if (local_38 != pcVar1) {
      if (*piVar2 == 0) {
LAB_0010ba6a:
        *piVar2 = iVar4;
      }
      else if (*piVar2 == 0x22) {
        fVar5 = (float)std::__throw_out_of_range("stof");
        goto LAB_0010ba6a;
      }
      r[1] = fVar5;
      pcVar1 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[3]._M_dataplus._M_p;
      iVar4 = *piVar2;
      *piVar2 = 0;
      fVar5 = strtof(pcVar1,&local_38);
      if (local_38 != pcVar1) {
        if (*piVar2 != 0) {
          if (*piVar2 != 0x22) goto LAB_0010baae;
          fVar5 = (float)std::__throw_out_of_range("stof");
        }
        *piVar2 = iVar4;
LAB_0010baae:
        r[2] = fVar5;
        return;
      }
      goto LAB_0010badb;
    }
  }
  std::__throw_invalid_argument("stof");
LAB_0010badb:
  uVar3 = std::__throw_invalid_argument("stof");
  if (*piVar2 == 0) {
    *piVar2 = iVar4;
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void record_token_rgb(vec3 r, const vector<string> tokens){
    r[0] = stof(tokens[1]);
    r[1] = stof(tokens[2]);
    r[2] = stof(tokens[3]);
}